

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

iterator __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,iterator pos)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  NodePtr pDVar4;
  ulong *puVar5;
  uint8_t *puVar6;
  iterator iVar7;
  
  puVar6 = pos.mInfo;
  pDVar4 = pos.mKeyVals;
  shiftDown(this,((long)pDVar4 - (long)this->mKeyVals >> 3) * -0x3333333333333333);
  this->mNumElements = this->mNumElements - 1;
  if (*puVar6 == '\0') {
    pDVar4 = pDVar4 + 1;
    uVar3 = *(ulong *)(puVar6 + 1);
    if (uVar3 == 0) {
      puVar2 = (ulong *)(puVar6 + 9);
      do {
        puVar5 = puVar2;
        pDVar4 = pDVar4 + 8;
        uVar3 = *puVar5;
        puVar2 = puVar5 + 1;
      } while (uVar3 == 0);
    }
    else {
      puVar5 = (ulong *)(puVar6 + 1);
    }
    uVar1 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    uVar3 = uVar1 >> 3 & 0x1fffffff;
    puVar6 = (uint8_t *)((long)puVar5 + uVar3);
    pDVar4 = pDVar4 + uVar3;
  }
  iVar7.mInfo = puVar6;
  iVar7.mKeyVals = pDVar4;
  return iVar7;
}

Assistant:

iterator erase(iterator pos) {
        ROBIN_HOOD_TRACE(this)
        // we assume that pos always points to a valid entry, and not end().
        auto const idx = static_cast<size_t>(pos.mKeyVals - mKeyVals);

        shiftDown(idx);
        --mNumElements;

        if (*pos.mInfo) {
            // we've backward shifted, return this again
            return pos;
        }

        // no backward shift, return next element
        return ++pos;
    }